

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * namePop(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  long lVar3;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->nameNr;
    lVar3 = (long)iVar1;
    if (0 < lVar3) {
      ctxt->nameNr = iVar1 + -1;
      if (iVar1 == 1) {
        pxVar2 = (xmlChar *)0x0;
      }
      else {
        pxVar2 = ctxt->nameTab[lVar3 + -2];
      }
      ctxt->name = pxVar2;
      pxVar2 = ctxt->nameTab[lVar3 + -1];
      ctxt->nameTab[lVar3 + -1] = (xmlChar *)0x0;
      return pxVar2;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
namePop(xmlParserCtxtPtr ctxt)
{
    const xmlChar *ret;

    if ((ctxt == NULL) || (ctxt->nameNr <= 0))
        return (NULL);
    ctxt->nameNr--;
    if (ctxt->nameNr > 0)
        ctxt->name = ctxt->nameTab[ctxt->nameNr - 1];
    else
        ctxt->name = NULL;
    ret = ctxt->nameTab[ctxt->nameNr];
    ctxt->nameTab[ctxt->nameNr] = NULL;
    return (ret);
}